

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlyphBoundaries.cpp
# Opt level: O2

int GlyphBoundaries::OutputToGlatNonexistent(GrcBinaryStream *pbstrm)

{
  undefined1 *os;
  
  os = &(pbstrm->super_fstream).field_0x10;
  GrcBinaryStream::write_16bits_be((ostream *)os,0);
  GrcBinaryStream::write_8bits_be((ostream *)os,'\0');
  GrcBinaryStream::write_8bits_be((ostream *)os,'\0');
  GrcBinaryStream::write_8bits_be((ostream *)os,'\0');
  GrcBinaryStream::write_8bits_be((ostream *)os,'\0');
  return 6;
}

Assistant:

int GlyphBoundaries::OutputToGlatNonexistent(GrcBinaryStream * pbstrm)
{
	// Empty bitmap
	pbstrm->WriteShort(0);
	// 4 bogus diagonals
	pbstrm->WriteByte(0);
	pbstrm->WriteByte(0);
	pbstrm->WriteByte(0);
	pbstrm->WriteByte(0);

	return 6;
}